

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O0

vector<int,_std::allocator<int>_> *
QUtil::parse_numrange(vector<int,_std::allocator<int>_> *__return_storage_ptr__,char *range,int max)

{
  pointer *ppiVar1;
  size_t *psVar2;
  bool bVar3;
  int iVar4;
  size_t sVar5;
  pointer __s1;
  char *pcVar6;
  runtime_error *prVar7;
  const_reference pvVar8;
  iterator iVar9;
  iterator iVar10;
  reference piVar11;
  size_type sVar12;
  reference __args;
  string message;
  runtime_error *e;
  size_t i;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1c8;
  const_iterator local_1c0;
  int *local_1b8;
  int *local_1b0;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a8;
  __normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_> local_1a0;
  const_iterator local_198;
  int local_18c;
  iterator iStack_188;
  int n;
  iterator __end3;
  iterator __begin3;
  vector<int,_std::allocator<int>_> *__range3;
  undefined1 local_160 [8];
  set<int,_std::less<int>,_std::allocator<int>_> exclusions;
  vector<int,_std::allocator<int>_> work;
  int local_f8;
  int last_num;
  bool is_span;
  int local_d0;
  byte local_c9;
  int first_num;
  bool is_exclude;
  cmatch m;
  bool first;
  char *group_end;
  long local_90;
  size_t skip;
  size_t start_idx;
  vector<int,_std::allocator<int>_> last_group;
  vector<int,_std::allocator<int>_> result;
  char *range_end;
  char *p;
  anon_class_8_1_ba1d60c4 aStack_38;
  anon_class_1_0_00000001 populate;
  anon_class_8_1_ba1d60c4 parse_num;
  int local_1c;
  char *pcStack_18;
  int max_local;
  char *range_local;
  vector<int,_std::allocator<int>_> *filtered;
  
  local_1c = max;
  pcStack_18 = range;
  range_local = (char *)__return_storage_ptr__;
  if ((parse_numrange(char_const*,int)::group_re_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&parse_numrange(char_const*,int)::group_re_abi_cxx11_), iVar4 != 0
     )) {
    std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::basic_regex
              (&parse_numrange(char_const*,int)::group_re_abi_cxx11_,
               "(x)?(z|r?\\d+)(?:-(z|r?\\d+))?",0x10);
    __cxa_atexit(std::__cxx11::basic_regex<char,_std::__cxx11::regex_traits<char>_>::~basic_regex,
                 &parse_numrange(char_const*,int)::group_re_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&parse_numrange(char_const*,int)::group_re_abi_cxx11_);
  }
  pcVar6 = pcStack_18;
  aStack_38.max = &local_1c;
  sVar5 = strlen(pcStack_18);
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)
             &last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)&start_idx);
  skip = 0;
  local_90 = 1;
  group_end._7_1_ = 0x3a;
  __s1 = (pointer)std::find<char_const*,char>
                            (pcStack_18,pcVar6 + sVar5,(char *)((long)&group_end + 7));
  result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)(pcVar6 + sVar5);
  if ((char)*__s1 == ':') {
    iVar4 = strcmp((char *)__s1,":odd");
    if (iVar4 != 0) {
      iVar4 = strcmp((char *)__s1,":even");
      if (iVar4 != 0) {
        prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
        std::runtime_error::runtime_error(prVar7,"expected :even or :odd");
        __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
      }
      skip = 1;
    }
    local_90 = 2;
    result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = __s1;
  }
  range_end = pcStack_18;
  m._M_begin._7_1_ = 1;
  while( true ) {
    if ((pointer)range_end ==
        result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage) {
      ppiVar1 = &last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_1c8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)ppiVar1);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_1c0,
                 &local_1c8);
      iVar9 = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)&start_idx);
      iVar10 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)&start_idx);
      std::vector<int,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                ((vector<int,std::allocator<int>> *)ppiVar1,local_1c0,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current
                 ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  iVar10._M_current);
      if (local_90 == 1) {
        std::vector<int,_std::allocator<int>_>::vector
                  (__return_storage_ptr__,
                   (vector<int,_std::allocator<int>_> *)
                   &last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_end_of_storage);
      }
      else {
        std::vector<int,_std::allocator<int>_>::vector(__return_storage_ptr__);
        for (e = (runtime_error *)skip;
            prVar7 = (runtime_error *)
                     std::vector<int,_std::allocator<int>_>::size
                               ((vector<int,_std::allocator<int>_> *)
                                &last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                 super__Vector_impl_data._M_end_of_storage), e < prVar7;
            e = e + local_90) {
          __args = std::vector<int,_std::allocator<int>_>::at
                             ((vector<int,_std::allocator<int>_> *)
                              &last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_end_of_storage,(size_type)e);
          std::vector<int,std::allocator<int>>::emplace_back<int&>
                    ((vector<int,std::allocator<int>> *)__return_storage_ptr__,__args);
        }
      }
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)&start_idx);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_end_of_storage);
      return __return_storage_ptr__;
    }
    m._M_begin._6_1_ = 0x2c;
    pcVar6 = std::find<char_const*,char>
                       (range_end,
                        (char *)result.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                super__Vector_impl_data._M_end_of_storage,
                        (char *)((long)&m._M_begin + 6));
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                   *)&first_num);
    bVar3 = std::
            regex_match<char_const*,std::allocator<std::__cxx11::sub_match<char_const*>>,char,std::__cxx11::regex_traits<char>>
                      (range_end,pcVar6,
                       (match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                        *)&first_num,&parse_numrange(char_const*,int)::group_re_abi_cxx11_,0);
    if (!bVar3) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"invalid range syntax");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    pvVar8 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)&first_num,1);
    local_c9 = pvVar8->matched & 1;
    if (((m._M_begin._7_1_ & 1) != 0) && (local_c9 != 0)) {
      prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(prVar7,"first range group may not be an exclusion");
      __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    m._M_begin._7_1_ = 0;
    pvVar8 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)&first_num,2);
    std::__cxx11::sub_match<const_char_*>::str((string_type *)&last_num,pvVar8);
    iVar4 = parse_numrange::anon_class_8_1_ba1d60c4::operator()
                      (&stack0xffffffffffffffc8,(string *)&last_num);
    std::__cxx11::string::~string((string *)&last_num);
    local_d0 = iVar4;
    pvVar8 = std::__cxx11::
             match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
             operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                         *)&first_num,3);
    bVar3 = (bool)(pvVar8->matched & 1);
    local_f8 = 0;
    if (bVar3 != false) {
      pvVar8 = std::__cxx11::
               match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
               ::operator[]((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                             *)&first_num,3);
      std::__cxx11::sub_match<const_char_*>::str
                ((string_type *)
                 &work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage,pvVar8);
      local_f8 = parse_numrange::anon_class_8_1_ba1d60c4::operator()
                           (&stack0xffffffffffffffc8,
                            (string *)
                            &work.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &work.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                  ._M_end_of_storage);
    }
    if ((local_c9 & 1) == 0) {
      ppiVar1 = &last_group.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      local_1a0._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::end
                            ((vector<int,_std::allocator<int>_> *)ppiVar1);
      __gnu_cxx::__normal_iterator<int_const*,std::vector<int,std::allocator<int>>>::
      __normal_iterator<int*>
                ((__normal_iterator<int_const*,std::vector<int,std::allocator<int>>> *)&local_198,
                 &local_1a0);
      local_1a8._M_current =
           (int *)std::vector<int,_std::allocator<int>_>::begin
                            ((vector<int,_std::allocator<int>_> *)&start_idx);
      local_1b0 = (int *)std::vector<int,_std::allocator<int>_>::end
                                   ((vector<int,_std::allocator<int>_> *)&start_idx);
      local_1b8 = (int *)std::vector<int,std::allocator<int>>::
                         insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>,void>
                                   ((vector<int,std::allocator<int>> *)ppiVar1,local_198,local_1a8,
                                    (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>
                                     )local_1b0);
      parse_numrange::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)((long)&p + 7),
                 (vector<int,_std::allocator<int>_> *)&start_idx,local_d0,bVar3,local_f8);
    }
    else {
      psVar2 = &exclusions._M_t._M_impl.super__Rb_tree_header._M_node_count;
      std::vector<int,_std::allocator<int>_>::vector((vector<int,_std::allocator<int>_> *)psVar2);
      parse_numrange::anon_class_1_0_00000001::operator()
                ((anon_class_1_0_00000001 *)((long)&p + 7),
                 (vector<int,_std::allocator<int>_> *)psVar2,local_d0,bVar3,local_f8);
      std::set<int,_std::less<int>,_std::allocator<int>_>::set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_160);
      psVar2 = &exclusions._M_t._M_impl.super__Rb_tree_header._M_node_count;
      iVar9 = std::vector<int,_std::allocator<int>_>::begin
                        ((vector<int,_std::allocator<int>_> *)psVar2);
      iVar10 = std::vector<int,_std::allocator<int>_>::end
                         ((vector<int,_std::allocator<int>_> *)psVar2);
      std::set<int,std::less<int>,std::allocator<int>>::
      insert<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
                ((set<int,std::less<int>,std::allocator<int>> *)local_160,
                 (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)iVar9._M_current
                 ,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                  iVar10._M_current);
      std::vector<int,_std::allocator<int>_>::operator=
                ((vector<int,_std::allocator<int>_> *)
                 &exclusions._M_t._M_impl.super__Rb_tree_header._M_node_count,
                 (vector<int,_std::allocator<int>_> *)&start_idx);
      std::vector<int,_std::allocator<int>_>::clear((vector<int,_std::allocator<int>_> *)&start_idx)
      ;
      psVar2 = &exclusions._M_t._M_impl.super__Rb_tree_header._M_node_count;
      __end3 = std::vector<int,_std::allocator<int>_>::begin
                         ((vector<int,_std::allocator<int>_> *)psVar2);
      iStack_188 = std::vector<int,_std::allocator<int>_>::end
                             ((vector<int,_std::allocator<int>_> *)psVar2);
      while (bVar3 = __gnu_cxx::operator!=(&__end3,&stack0xfffffffffffffe78), bVar3) {
        piVar11 = __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::
                  operator*(&__end3);
        local_18c = *piVar11;
        sVar12 = std::set<int,_std::less<int>,_std::allocator<int>_>::count
                           ((set<int,_std::less<int>,_std::allocator<int>_> *)local_160,&local_18c);
        if (sVar12 == 0) {
          std::vector<int,std::allocator<int>>::emplace_back<int&>
                    ((vector<int,std::allocator<int>> *)&start_idx,&local_18c);
        }
        __gnu_cxx::__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>::operator++
                  (&__end3);
      }
      std::set<int,_std::less<int>,_std::allocator<int>_>::~set
                ((set<int,_std::less<int>,_std::allocator<int>_> *)local_160);
      std::vector<int,_std::allocator<int>_>::~vector
                ((vector<int,_std::allocator<int>_> *)
                 &exclusions._M_t._M_impl.super__Rb_tree_header._M_node_count);
    }
    range_end = pcVar6;
    if ((*pcVar6 == ',') &&
       (range_end = pcVar6 + 1,
       (pointer)range_end ==
       result.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
       _M_end_of_storage)) break;
    std::__cxx11::
    match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>::
    ~match_results((match_results<const_char_*,_std::allocator<std::__cxx11::sub_match<const_char_*>_>_>
                    *)&first_num);
  }
  prVar7 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(prVar7,"trailing comma");
  __cxa_throw(prVar7,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

std::vector<int>
QUtil::parse_numrange(char const* range, int max)
{
    // Performance note: this implementation aims to be straightforward, not efficient. Numeric
    // range parsing is used only during argument processing. It is not used during processing of
    // PDF files.

    static std::regex group_re(R"((x)?(z|r?\d+)(?:-(z|r?\d+))?)");
    auto parse_num = [&max](std::string const& s) -> int {
        if (s == "z") {
            return max;
        }
        int num;
        if (s.at(0) == 'r') {
            num = max + 1 - string_to_int(s.substr(1).c_str());
        } else {
            num = string_to_int(s.c_str());
        }
        // max == 0 means we don't know the max and are just testing for valid syntax.
        if ((max > 0) && ((num < 1) || (num > max))) {
            throw std::runtime_error("number " + std::to_string(num) + " out of range");
        }
        return num;
    };

    auto populate = [](std::vector<int>& group, int first_num, bool is_span, int last_num) {
        group.clear();
        group.emplace_back(first_num);
        if (is_span) {
            if (first_num > last_num) {
                for (auto i = first_num - 1; i >= last_num; --i) {
                    group.push_back(i);
                }
            } else {
                for (auto i = first_num + 1; i <= last_num; ++i) {
                    group.push_back(i);
                }
            }
        }
    };

    char const* p;
    try {
        char const* range_end = range + strlen(range);
        std::vector<int> result;
        std::vector<int> last_group;
        // See if range ends with :even or :odd.
        size_t start_idx = 0;
        size_t skip = 1;
        p = std::find(range, range_end, ':');
        if (*p == ':') {
            if (strcmp(p, ":odd") == 0) {
                skip = 2;
            } else if (strcmp(p, ":even") == 0) {
                skip = 2;
                start_idx = 1;
            } else {
                throw std::runtime_error("expected :even or :odd");
            }
            range_end = p;
        }

        // Divide the range into groups
        p = range;
        char const* group_end;
        bool first = true;
        while (p != range_end) {
            group_end = std::find(p, range_end, ',');
            std::cmatch m;
            if (!std::regex_match(p, group_end, m, group_re)) {
                throw std::runtime_error("invalid range syntax");
            }
            auto is_exclude = m[1].matched;
            if (first && is_exclude) {
                throw std::runtime_error("first range group may not be an exclusion");
            }
            first = false;
            auto first_num = parse_num(m[2].str());
            auto is_span = m[3].matched;
            int last_num{0};
            if (is_span) {
                last_num = parse_num(m[3].str());
            }
            if (is_exclude) {
                std::vector<int> work;
                populate(work, first_num, is_span, last_num);
                std::set<int> exclusions;
                exclusions.insert(work.begin(), work.end());
                work = last_group;
                last_group.clear();
                for (auto n: work) {
                    if (exclusions.count(n) == 0) {
                        last_group.emplace_back(n);
                    }
                }
            } else {
                result.insert(result.end(), last_group.begin(), last_group.end());
                populate(last_group, first_num, is_span, last_num);
            }
            p = group_end;
            if (*p == ',') {
                ++p;
                if (p == range_end) {
                    throw std::runtime_error("trailing comma");
                }
            }
        }
        result.insert(result.end(), last_group.begin(), last_group.end());
        if (skip == 1) {
            return result;
        }
        std::vector<int> filtered;
        for (auto i = start_idx; i < result.size(); i += skip) {
            filtered.emplace_back(result.at(i));
        }
        return filtered;
    } catch (std::runtime_error const& e) {
        std::string message;
        if (p) {
            message = "error at * in numeric range " +
                std::string(range, QIntC::to_size(p - range)) + "*" + p + ": " + e.what();
        } else {
            message = "error in numeric range " + std::string(range) + ": " + e.what();
        }
        throw std::runtime_error(message);
    }
}